

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

void just::environment::append_to_path(string *item_)

{
  string *item__00;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  string local_68;
  allocator<char> local_31;
  string local_30;
  string *local_10;
  string *item__local;
  
  local_10 = item_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"PATH",&local_31);
  item__00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"PATH",&local_a9);
  get(&local_88,&local_a8);
  impl::append_to_path(&local_68,item__00,&local_88);
  set(&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

inline void append_to_path(const std::string& item_)
    {
      set("PATH", impl::append_to_path(item_, get("PATH")));
    }